

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linei_intersector.h
# Opt level: O2

bool embree::avx::FlatLinearCurveMiIntersector1<8,_true>::occluded
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *line)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  Geometry *pGVar10;
  long lVar11;
  RTCFilterFunctionN p_Var12;
  ulong uVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  Scene *pSVar20;
  undefined4 uVar21;
  long lVar22;
  ulong uVar23;
  float fVar24;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  float fVar34;
  float fVar40;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar38;
  float fVar39;
  float fVar41;
  float fVar42;
  float fVar43;
  undefined1 auVar37 [32];
  float fVar44;
  float fVar45;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  float fVar54;
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  undefined1 auVar75 [32];
  float fVar76;
  float fVar77;
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  Scene *scene;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  LineIntersectorHitM<8> hit;
  int local_2e4;
  RayQueryContext *local_2e0;
  Scene *local_2d8;
  undefined4 local_2d0;
  undefined4 local_2cc;
  undefined4 local_2c8;
  undefined4 local_2c4;
  undefined4 local_2c0;
  uint local_2bc;
  uint local_2b8;
  uint local_2b4;
  uint local_2b0;
  undefined1 local_2a0 [32];
  RTCFilterFunctionNArguments local_270;
  undefined1 local_240 [32];
  undefined1 local_220 [16];
  undefined1 local_210 [16];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [2] [32];
  
  pSVar20 = context->scene;
  uVar1 = line->sharedGeomID;
  uVar2 = (line->v0).field_0.i[0];
  pGVar10 = (pSVar20->geometries).items[uVar1].ptr;
  lVar11 = *(long *)&pGVar10[1].time_range.upper;
  p_Var12 = pGVar10[1].intersectionFilterN;
  uVar3 = (line->v0).field_0.i[1];
  uVar4 = (line->v0).field_0.i[2];
  uVar5 = (line->v0).field_0.i[4];
  auVar25._16_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)uVar5 * (long)p_Var12);
  auVar25._0_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)uVar2 * (long)p_Var12);
  uVar6 = (line->v0).field_0.i[3];
  uVar7 = (line->v0).field_0.i[5];
  auVar37._16_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)uVar7 * (long)p_Var12);
  auVar37._0_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)uVar3 * (long)p_Var12);
  uVar8 = (line->v0).field_0.i[6];
  auVar46._16_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)uVar8 * (long)p_Var12);
  auVar46._0_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)uVar4 * (long)p_Var12);
  uVar9 = (line->v0).field_0.i[7];
  lVar22 = (ulong)uVar9 * (long)p_Var12;
  auVar55._16_16_ = *(undefined1 (*) [16])(lVar11 + lVar22);
  auVar55._0_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)uVar6 * (long)p_Var12);
  auVar59._16_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)(uVar5 + 1) * (long)p_Var12);
  auVar59._0_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)(uVar2 + 1) * (long)p_Var12);
  auVar61._16_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)(uVar7 + 1) * (long)p_Var12);
  auVar61._0_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)(uVar3 + 1) * (long)p_Var12);
  auVar66._16_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)(uVar8 + 1) * (long)p_Var12);
  auVar66._0_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)(uVar4 + 1) * (long)p_Var12);
  auVar64._16_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)(uVar9 + 1) * (long)p_Var12);
  auVar64._0_16_ = *(undefined1 (*) [16])(lVar11 + (ulong)(uVar6 + 1) * (long)p_Var12);
  auVar17 = vunpcklps_avx(auVar25,auVar46);
  auVar14 = vunpckhps_avx(auVar25,auVar46);
  auVar25 = vunpcklps_avx(auVar37,auVar55);
  auVar15 = vunpckhps_avx(auVar37,auVar55);
  local_2a0 = vunpcklps_avx(auVar17,auVar25);
  local_1e0 = vunpckhps_avx(auVar17,auVar25);
  local_200 = vunpcklps_avx(auVar14,auVar15);
  local_140 = vunpckhps_avx(auVar14,auVar15);
  auVar17 = vunpcklps_avx(auVar59,auVar66);
  auVar16 = vunpckhps_avx(auVar59,auVar66);
  auVar25 = vunpcklps_avx(auVar61,auVar64);
  auVar14 = vunpckhps_avx(auVar61,auVar64);
  local_1a0 = vunpcklps_avx(auVar17,auVar25);
  local_1c0 = vunpckhps_avx(auVar17,auVar25);
  local_240 = vunpcklps_avx(auVar16,auVar14);
  auVar35 = vpcmpeqd_avx(auVar17._0_16_,auVar17._0_16_);
  auVar36 = vpcmpeqd_avx(auVar35,*(undefined1 (*) [16])(line->primIDs).field_0.field_1.vl);
  local_180 = vunpckhps_avx(auVar16,auVar14);
  auVar35 = vpcmpeqd_avx(auVar35,*(undefined1 (*) [16])((long)&(line->primIDs).field_0 + 0x10));
  local_210 = vshufps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0);
  local_220 = local_210;
  fVar24 = (pre->ray_space).vy.field_0.m128[0];
  fVar28 = (pre->ray_space).vz.field_0.m128[0];
  uVar21 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
  auVar78._4_4_ = uVar21;
  auVar78._0_4_ = uVar21;
  auVar78._8_4_ = uVar21;
  auVar78._12_4_ = uVar21;
  auVar78._16_4_ = uVar21;
  auVar78._20_4_ = uVar21;
  auVar78._24_4_ = uVar21;
  auVar78._28_4_ = uVar21;
  local_160._16_16_ = auVar35;
  local_160._0_16_ = auVar36;
  uVar21 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
  auVar80._4_4_ = uVar21;
  auVar80._0_4_ = uVar21;
  auVar80._8_4_ = uVar21;
  auVar80._12_4_ = uVar21;
  auVar80._16_4_ = uVar21;
  auVar80._20_4_ = uVar21;
  auVar80._24_4_ = uVar21;
  auVar80._28_4_ = uVar21;
  auVar14 = vsubps_avx(local_1e0,auVar78);
  auVar17 = vsubps_avx(local_200,auVar80);
  fVar40 = auVar17._0_4_;
  fVar48 = auVar17._4_4_;
  fVar43 = auVar17._8_4_;
  fVar44 = auVar17._12_4_;
  fVar51 = auVar17._16_4_;
  fVar53 = auVar17._20_4_;
  fVar76 = auVar17._24_4_;
  fVar45 = auVar14._0_4_;
  fVar42 = auVar14._4_4_;
  fVar38 = auVar14._8_4_;
  fVar50 = auVar14._12_4_;
  fVar52 = auVar14._16_4_;
  fVar54 = auVar14._20_4_;
  fVar77 = auVar14._24_4_;
  fVar29 = (pre->ray_space).vy.field_0.m128[1];
  auVar36 = vpermilps_avx((undefined1  [16])(pre->ray_space).vy.field_0,0xaa);
  fVar30 = (pre->ray_space).vz.field_0.m128[1];
  fVar31 = (pre->ray_space).vz.field_0.m128[2];
  fVar41 = auVar36._0_4_;
  fVar49 = auVar36._4_4_;
  fVar39 = auVar36._8_4_;
  fVar32 = (pre->ray_space).vx.field_0.m128[0];
  uVar21 = *(undefined4 *)&(ray->org).field_0;
  auVar65._4_4_ = uVar21;
  auVar65._0_4_ = uVar21;
  auVar65._8_4_ = uVar21;
  auVar65._12_4_ = uVar21;
  auVar65._16_4_ = uVar21;
  auVar65._20_4_ = uVar21;
  auVar65._24_4_ = uVar21;
  auVar65._28_4_ = uVar21;
  auVar25 = vsubps_avx(local_2a0,auVar65);
  fVar68 = auVar25._0_4_;
  fVar69 = auVar25._4_4_;
  fVar70 = auVar25._8_4_;
  fVar71 = auVar25._12_4_;
  fVar72 = auVar25._16_4_;
  fVar73 = auVar25._20_4_;
  fVar74 = auVar25._24_4_;
  auVar67._0_4_ = fVar68 * fVar32 + fVar24 * fVar45 + fVar28 * fVar40;
  auVar67._4_4_ = fVar69 * fVar32 + fVar24 * fVar42 + fVar28 * fVar48;
  auVar67._8_4_ = fVar70 * fVar32 + fVar24 * fVar38 + fVar28 * fVar43;
  auVar67._12_4_ = fVar71 * fVar32 + fVar24 * fVar50 + fVar28 * fVar44;
  auVar67._16_4_ = fVar72 * fVar32 + fVar24 * fVar52 + fVar28 * fVar51;
  auVar67._20_4_ = fVar73 * fVar32 + fVar24 * fVar54 + fVar28 * fVar53;
  auVar67._24_4_ = fVar74 * fVar32 + fVar24 * fVar77 + fVar28 * fVar76;
  auVar67._28_4_ = auVar17._28_4_ + auVar16._28_4_ + 0.0;
  fVar33 = (pre->ray_space).vx.field_0.m128[1];
  auVar47._0_4_ = fVar33 * fVar68 + fVar45 * fVar29 + fVar40 * fVar30;
  auVar47._4_4_ = fVar33 * fVar69 + fVar42 * fVar29 + fVar48 * fVar30;
  auVar47._8_4_ = fVar33 * fVar70 + fVar38 * fVar29 + fVar43 * fVar30;
  auVar47._12_4_ = fVar33 * fVar71 + fVar50 * fVar29 + fVar44 * fVar30;
  auVar47._16_4_ = fVar33 * fVar72 + fVar52 * fVar29 + fVar51 * fVar30;
  auVar47._20_4_ = fVar33 * fVar73 + fVar54 * fVar29 + fVar53 * fVar30;
  auVar47._24_4_ = fVar33 * fVar74 + fVar77 * fVar29 + fVar76 * fVar30;
  auVar47._28_4_ = local_2a0._28_4_ + auVar15._28_4_ + auVar35._12_4_;
  fVar34 = (pre->ray_space).vx.field_0.m128[2];
  auVar75._0_4_ = fVar68 * fVar34 + fVar45 * fVar41 + fVar40 * fVar31;
  auVar75._4_4_ = fVar69 * fVar34 + fVar42 * fVar49 + fVar48 * fVar31;
  auVar75._8_4_ = fVar70 * fVar34 + fVar38 * fVar39 + fVar43 * fVar31;
  auVar75._12_4_ = fVar71 * fVar34 + fVar50 * auVar36._12_4_ + fVar44 * fVar31;
  auVar75._16_4_ = fVar72 * fVar34 + fVar52 * fVar41 + fVar51 * fVar31;
  auVar75._20_4_ = fVar73 * fVar34 + fVar54 * fVar49 + fVar53 * fVar31;
  auVar75._24_4_ = fVar74 * fVar34 + fVar77 * fVar39 + fVar76 * fVar31;
  auVar75._28_4_ = auVar25._28_4_ + auVar14._28_4_ + auVar17._28_4_;
  auVar14 = vsubps_avx(local_240,auVar80);
  fVar40 = auVar14._0_4_;
  fVar42 = auVar14._4_4_;
  fVar44 = auVar14._8_4_;
  fVar52 = auVar14._12_4_;
  fVar76 = auVar14._16_4_;
  fVar69 = auVar14._20_4_;
  fVar72 = auVar14._24_4_;
  auVar14 = vsubps_avx(local_1c0,auVar78);
  fVar45 = auVar14._0_4_;
  fVar43 = auVar14._4_4_;
  fVar50 = auVar14._8_4_;
  fVar53 = auVar14._12_4_;
  fVar77 = auVar14._16_4_;
  fVar70 = auVar14._20_4_;
  fVar73 = auVar14._24_4_;
  auVar14 = vsubps_avx(local_1a0,auVar65);
  fVar48 = auVar14._0_4_;
  fVar38 = auVar14._4_4_;
  fVar51 = auVar14._8_4_;
  fVar54 = auVar14._12_4_;
  fVar68 = auVar14._16_4_;
  fVar71 = auVar14._20_4_;
  fVar74 = auVar14._24_4_;
  auVar60._0_4_ = fVar24 * fVar45 + fVar28 * fVar40 + fVar32 * fVar48;
  auVar60._4_4_ = fVar24 * fVar43 + fVar28 * fVar42 + fVar32 * fVar38;
  auVar60._8_4_ = fVar24 * fVar50 + fVar28 * fVar44 + fVar32 * fVar51;
  auVar60._12_4_ = fVar24 * fVar53 + fVar28 * fVar52 + fVar32 * fVar54;
  auVar60._16_4_ = fVar24 * fVar77 + fVar28 * fVar76 + fVar32 * fVar68;
  auVar60._20_4_ = fVar24 * fVar70 + fVar28 * fVar69 + fVar32 * fVar71;
  auVar60._24_4_ = fVar24 * fVar73 + fVar28 * fVar72 + fVar32 * fVar74;
  auVar60._28_4_ = fVar24 + fVar28 + local_1a0._28_4_;
  auVar26._0_4_ = fVar33 * fVar48 + fVar45 * fVar29 + fVar40 * fVar30;
  auVar26._4_4_ = fVar33 * fVar38 + fVar43 * fVar29 + fVar42 * fVar30;
  auVar26._8_4_ = fVar33 * fVar51 + fVar50 * fVar29 + fVar44 * fVar30;
  auVar26._12_4_ = fVar33 * fVar54 + fVar53 * fVar29 + fVar52 * fVar30;
  auVar26._16_4_ = fVar33 * fVar68 + fVar77 * fVar29 + fVar76 * fVar30;
  auVar26._20_4_ = fVar33 * fVar71 + fVar70 * fVar29 + fVar69 * fVar30;
  auVar26._24_4_ = fVar33 * fVar74 + fVar73 * fVar29 + fVar72 * fVar30;
  auVar26._28_4_ = fVar32 + fVar29 + fVar30;
  auVar79._0_4_ = fVar34 * fVar48 + fVar45 * fVar41 + fVar40 * fVar31;
  auVar79._4_4_ = fVar34 * fVar38 + fVar43 * fVar49 + fVar42 * fVar31;
  auVar79._8_4_ = fVar34 * fVar51 + fVar50 * fVar39 + fVar44 * fVar31;
  auVar79._12_4_ = fVar34 * fVar54 + fVar53 * auVar36._12_4_ + fVar52 * fVar31;
  auVar79._16_4_ = fVar34 * fVar68 + fVar77 * fVar41 + fVar76 * fVar31;
  auVar79._20_4_ = fVar34 * fVar71 + fVar70 * fVar49 + fVar69 * fVar31;
  auVar79._24_4_ = fVar34 * fVar74 + fVar73 * fVar39 + fVar72 * fVar31;
  auVar79._28_4_ = auVar14._28_4_ + fVar30 + fVar31;
  auVar17 = vsubps_avx(auVar60,auVar67);
  auVar25 = vsubps_avx(auVar26,auVar47);
  fVar24 = auVar25._0_4_;
  fVar29 = auVar25._4_4_;
  fVar31 = auVar25._8_4_;
  fVar33 = auVar25._12_4_;
  fVar45 = auVar25._16_4_;
  fVar48 = auVar25._20_4_;
  fVar49 = auVar25._24_4_;
  fVar28 = auVar17._0_4_;
  fVar30 = auVar17._4_4_;
  fVar32 = auVar17._8_4_;
  fVar40 = auVar17._12_4_;
  fVar41 = auVar17._16_4_;
  fVar42 = auVar17._20_4_;
  fVar43 = auVar17._24_4_;
  auVar56._0_4_ = fVar28 * fVar28 + fVar24 * fVar24;
  auVar56._4_4_ = fVar30 * fVar30 + fVar29 * fVar29;
  auVar56._8_4_ = fVar32 * fVar32 + fVar31 * fVar31;
  auVar56._12_4_ = fVar40 * fVar40 + fVar33 * fVar33;
  auVar56._16_4_ = fVar41 * fVar41 + fVar45 * fVar45;
  auVar56._20_4_ = fVar42 * fVar42 + fVar48 * fVar48;
  auVar56._24_4_ = fVar43 * fVar43 + fVar49 * fVar49;
  auVar56._28_4_ = auVar60._28_4_ + auVar14._28_4_;
  auVar15._4_4_ = fVar29 * -auVar47._4_4_;
  auVar15._0_4_ = fVar24 * -auVar47._0_4_;
  auVar15._8_4_ = fVar31 * -auVar47._8_4_;
  auVar15._12_4_ = fVar33 * -auVar47._12_4_;
  auVar15._16_4_ = fVar45 * -auVar47._16_4_;
  auVar15._20_4_ = fVar48 * -auVar47._20_4_;
  auVar15._24_4_ = fVar49 * -auVar47._24_4_;
  auVar15._28_4_ = -auVar47._28_4_;
  auVar14 = vrcpps_avx(auVar56);
  auVar16._4_4_ = auVar67._4_4_ * fVar30;
  auVar16._0_4_ = auVar67._0_4_ * fVar28;
  auVar16._8_4_ = auVar67._8_4_ * fVar32;
  auVar16._12_4_ = auVar67._12_4_ * fVar40;
  auVar16._16_4_ = auVar67._16_4_ * fVar41;
  auVar16._20_4_ = auVar67._20_4_ * fVar42;
  auVar16._24_4_ = auVar67._24_4_ * fVar43;
  auVar16._28_4_ = fVar34;
  auVar15 = vsubps_avx(auVar15,auVar16);
  auVar62._8_4_ = 0x3f800000;
  auVar62._0_8_ = 0x3f8000003f800000;
  auVar62._12_4_ = 0x3f800000;
  auVar62._16_4_ = 0x3f800000;
  auVar62._20_4_ = 0x3f800000;
  auVar62._24_4_ = 0x3f800000;
  auVar62._28_4_ = 0x3f800000;
  fVar34 = auVar14._0_4_;
  fVar38 = auVar14._4_4_;
  auVar18._4_4_ = fVar38 * auVar56._4_4_;
  auVar18._0_4_ = fVar34 * auVar56._0_4_;
  fVar39 = auVar14._8_4_;
  auVar18._8_4_ = fVar39 * auVar56._8_4_;
  fVar44 = auVar14._12_4_;
  auVar18._12_4_ = fVar44 * auVar56._12_4_;
  fVar50 = auVar14._16_4_;
  auVar18._16_4_ = fVar50 * auVar56._16_4_;
  fVar51 = auVar14._20_4_;
  auVar18._20_4_ = fVar51 * auVar56._20_4_;
  fVar52 = auVar14._24_4_;
  auVar18._24_4_ = fVar52 * auVar56._24_4_;
  auVar18._28_4_ = auVar56._28_4_;
  auVar16 = vsubps_avx(auVar62,auVar18);
  auVar19._4_4_ = auVar15._4_4_ * (fVar38 + fVar38 * auVar16._4_4_);
  auVar19._0_4_ = auVar15._0_4_ * (fVar34 + fVar34 * auVar16._0_4_);
  auVar19._8_4_ = auVar15._8_4_ * (fVar39 + fVar39 * auVar16._8_4_);
  auVar19._12_4_ = auVar15._12_4_ * (fVar44 + fVar44 * auVar16._12_4_);
  auVar19._16_4_ = auVar15._16_4_ * (fVar50 + fVar50 * auVar16._16_4_);
  auVar19._20_4_ = auVar15._20_4_ * (fVar51 + fVar51 * auVar16._20_4_);
  auVar19._24_4_ = auVar15._24_4_ * (fVar52 + fVar52 * auVar16._24_4_);
  auVar19._28_4_ = auVar14._28_4_ + auVar16._28_4_;
  auVar14 = vminps_avx(auVar19,auVar62);
  local_120 = vmaxps_avx(auVar14,ZEXT832(0) << 0x20);
  fVar50 = local_120._0_4_;
  fVar51 = local_120._4_4_;
  fVar52 = local_120._8_4_;
  fVar53 = local_120._12_4_;
  fVar54 = local_120._16_4_;
  fVar76 = local_120._20_4_;
  fVar77 = local_120._24_4_;
  fVar34 = auVar67._0_4_ + fVar50 * fVar28;
  fVar38 = auVar67._4_4_ + fVar51 * fVar30;
  fVar39 = auVar67._8_4_ + fVar52 * fVar32;
  fVar40 = auVar67._12_4_ + fVar53 * fVar40;
  fVar41 = auVar67._16_4_ + fVar54 * fVar41;
  fVar42 = auVar67._20_4_ + fVar76 * fVar42;
  fVar43 = auVar67._24_4_ + fVar77 * fVar43;
  fVar44 = auVar67._28_4_ + auVar17._28_4_;
  fVar24 = auVar47._0_4_ + fVar50 * fVar24;
  fVar28 = auVar47._4_4_ + fVar51 * fVar29;
  fVar29 = auVar47._8_4_ + fVar52 * fVar31;
  fVar30 = auVar47._12_4_ + fVar53 * fVar33;
  fVar31 = auVar47._16_4_ + fVar54 * fVar45;
  fVar32 = auVar47._20_4_ + fVar76 * fVar48;
  fVar33 = auVar47._24_4_ + fVar77 * fVar49;
  auVar14 = vsubps_avx(auVar79,auVar75);
  local_e0._0_4_ = auVar75._0_4_ + fVar50 * auVar14._0_4_;
  local_e0._4_4_ = auVar75._4_4_ + fVar51 * auVar14._4_4_;
  local_e0._8_4_ = auVar75._8_4_ + fVar52 * auVar14._8_4_;
  local_e0._12_4_ = auVar75._12_4_ + fVar53 * auVar14._12_4_;
  local_e0._16_4_ = auVar75._16_4_ + fVar54 * auVar14._16_4_;
  local_e0._20_4_ = auVar75._20_4_ + fVar76 * auVar14._20_4_;
  local_e0._24_4_ = auVar75._24_4_ + fVar77 * auVar14._24_4_;
  local_e0._28_4_ = auVar75._28_4_ + auVar14._28_4_;
  auVar14 = vsubps_avx(local_180,local_140);
  fVar45 = local_140._0_4_ + fVar50 * auVar14._0_4_;
  fVar48 = local_140._4_4_ + fVar51 * auVar14._4_4_;
  fVar49 = local_140._8_4_ + fVar52 * auVar14._8_4_;
  fVar50 = local_140._12_4_ + fVar53 * auVar14._12_4_;
  fVar51 = local_140._16_4_ + fVar54 * auVar14._16_4_;
  fVar52 = local_140._20_4_ + fVar76 * auVar14._20_4_;
  fVar53 = local_140._24_4_ + fVar77 * auVar14._24_4_;
  fVar54 = local_140._28_4_ + auVar14._28_4_;
  auVar27._0_4_ = fVar34 * fVar34 + fVar24 * fVar24;
  auVar27._4_4_ = fVar38 * fVar38 + fVar28 * fVar28;
  auVar27._8_4_ = fVar39 * fVar39 + fVar29 * fVar29;
  auVar27._12_4_ = fVar40 * fVar40 + fVar30 * fVar30;
  auVar27._16_4_ = fVar41 * fVar41 + fVar31 * fVar31;
  auVar27._20_4_ = fVar42 * fVar42 + fVar32 * fVar32;
  auVar27._24_4_ = fVar43 * fVar43 + fVar33 * fVar33;
  auVar27._28_4_ = fVar44 + auVar47._28_4_ + auVar25._28_4_;
  auVar14._4_4_ = fVar48 * fVar48;
  auVar14._0_4_ = fVar45 * fVar45;
  auVar14._8_4_ = fVar49 * fVar49;
  auVar14._12_4_ = fVar50 * fVar50;
  auVar14._16_4_ = fVar51 * fVar51;
  auVar14._20_4_ = fVar52 * fVar52;
  auVar14._24_4_ = fVar53 * fVar53;
  auVar14._28_4_ = fVar44;
  uVar21 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar57._4_4_ = uVar21;
  auVar57._0_4_ = uVar21;
  auVar57._8_4_ = uVar21;
  auVar57._12_4_ = uVar21;
  auVar57._16_4_ = uVar21;
  auVar57._20_4_ = uVar21;
  auVar57._24_4_ = uVar21;
  auVar57._28_4_ = uVar21;
  auVar17 = vcmpps_avx(auVar27,auVar14,2);
  auVar14 = vcmpps_avx(auVar57,local_e0,2);
  fVar24 = ray->tfar;
  auVar58._4_4_ = fVar24;
  auVar58._0_4_ = fVar24;
  auVar58._8_4_ = fVar24;
  auVar58._12_4_ = fVar24;
  auVar58._16_4_ = fVar24;
  auVar58._20_4_ = fVar24;
  auVar58._24_4_ = fVar24;
  auVar58._28_4_ = fVar24;
  auVar25 = vcmpps_avx(local_e0,auVar58,2);
  auVar14 = vandps_avx(auVar25,auVar14);
  fVar24 = pre->depth_scale;
  auVar14 = vandps_avx(auVar14,auVar17);
  auVar17._4_4_ = fVar24 * (fVar48 + fVar48);
  auVar17._0_4_ = fVar24 * (fVar45 + fVar45);
  auVar17._8_4_ = fVar24 * (fVar49 + fVar49);
  auVar17._12_4_ = fVar24 * (fVar50 + fVar50);
  auVar17._16_4_ = fVar24 * (fVar51 + fVar51);
  auVar17._20_4_ = fVar24 * (fVar52 + fVar52);
  auVar17._24_4_ = fVar24 * (fVar53 + fVar53);
  auVar17._28_4_ = fVar54 + fVar54;
  auVar17 = vcmpps_avx(local_e0,auVar17,6);
  auVar14 = vandps_avx(auVar17,auVar14);
  auVar35 = vpslld_avx(auVar14._0_16_,0x1f);
  auVar36 = vpsrad_avx(auVar35,0x1f);
  auVar35 = vpslld_avx(auVar14._16_16_,0x1f);
  auVar35 = vpsrad_avx(auVar35,0x1f);
  auVar63._16_16_ = auVar35;
  auVar63._0_16_ = auVar36;
  auVar14 = auVar63 & ~local_160;
  if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar14 >> 0x7f,0) != '\0') ||
        (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar14 >> 0xbf,0) != '\0') ||
      (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar14[0x1f] < '\0') {
    auVar14 = vandnps_avx(local_160,auVar63);
    local_c0 = vsubps_avx(local_1a0,local_2a0);
    local_a0 = vsubps_avx(local_1c0,local_1e0);
    local_80[0] = vsubps_avx(local_240,local_200);
    auVar17 = vcmpps_avx(ZEXT832(0) << 0x20,local_c0,4);
    auVar25 = vcmpps_avx(ZEXT832(0) << 0x20,local_a0,4);
    auVar25 = vorps_avx(auVar17,auVar25);
    auVar17 = vcmpps_avx(ZEXT832(0) << 0x20,local_80[0],4);
    auVar17 = vorps_avx(auVar25,auVar17);
    auVar25 = auVar14 & auVar17;
    if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar25 >> 0x7f,0) != '\0') ||
          (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar25 >> 0xbf,0) != '\0') ||
        (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar25[0x1f] < '\0')
    {
      fVar24 = ray->tfar;
      auVar14 = vandps_avx(auVar17,auVar14);
      local_100 = ZEXT832(0) << 0x20;
      uVar21 = vmovmskps_avx(auVar14);
      uVar23 = CONCAT44((int)((ulong)lVar22 >> 0x20),uVar21);
      local_2e0 = context;
      local_2d8 = pSVar20;
      do {
        local_270.hit = (RTCHitN *)&local_2d0;
        local_270.valid = &local_2e4;
        uVar13 = 0;
        if (uVar23 != 0) {
          for (; (uVar23 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
          }
        }
        local_2b8 = *(uint *)(local_220 + uVar13 * 4);
        pGVar10 = (pSVar20->geometries).items[local_2b8].ptr;
        if ((pGVar10->mask & ray->mask) != 0) {
          if ((local_2e0->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar10->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
            return true;
          }
          local_2a0._0_4_ = fVar24;
          local_2c4 = *(undefined4 *)(local_120 + uVar13 * 4);
          local_2c0 = *(undefined4 *)(local_100 + uVar13 * 4);
          local_2bc = (line->primIDs).field_0.i[uVar13];
          local_2d0 = *(undefined4 *)(local_c0 + uVar13 * 4);
          local_2cc = *(undefined4 *)(local_a0 + uVar13 * 4);
          local_2c8 = *(undefined4 *)(local_80[0] + uVar13 * 4);
          local_2b4 = local_2e0->user->instID[0];
          local_2b0 = local_2e0->user->instPrimID[0];
          ray->tfar = *(float *)(local_e0 + uVar13 * 4);
          local_2e4 = -1;
          local_270.geometryUserPtr = pGVar10->userPtr;
          local_270.context = local_2e0->user;
          local_270.N = 1;
          local_270.ray = (RTCRayN *)ray;
          if ((pGVar10->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
             ((*pGVar10->occlusionFilterN)(&local_270), *local_270.valid != 0)) {
            p_Var12 = local_2e0->args->filter;
            if ((p_Var12 == (RTCFilterFunctionN)0x0) ||
               ((((local_2e0->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                  RTC_RAY_QUERY_FLAG_INCOHERENT && (((pGVar10->field_8).field_0x2 & 0x40) == 0)) ||
                ((*p_Var12)(&local_270), *local_270.valid != 0)))) {
              return true;
            }
          }
          ray->tfar = (float)local_2a0._0_4_;
          pSVar20 = local_2d8;
          fVar24 = (float)local_2a0._0_4_;
        }
        uVar23 = uVar23 ^ 1L << (uVar13 & 0x3f);
      } while (uVar23 != 0);
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& line)
      {
        STAT3(shadow.trav_prims,1,1,1);
        const LineSegments* geom = context->scene->get<LineSegments>(line.geomID());
        Vec4vf<M> v0,v1; line.gather(v0,v1,geom);
        const vbool<M> valid = line.valid();
        return FlatLinearCurveIntersector1<M>::intersect(valid,ray,context,geom,pre,v0,v1,Occluded1EpilogM<M,filter>(ray,context,line.geomID(),line.primID()));
      }